

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::AccessChainTraverser::visitSymbol(AccessChainTraverser *this,TIntermSymbol *symbol)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar3 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x140))
                    ((long *)CONCAT44(extraout_var,iVar3));
  if (cVar1 != '\0') {
    iVar3 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol);
    this->topLevelStorageQualifier =
         *(TStorageQualifier *)(CONCAT44(extraout_var_00,iVar3) + 8) & 0x7f;
  }
  iVar3 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
  bVar2 = IsAnonymous((TString *)CONCAT44(extraout_var_01,iVar3));
  if (bVar2) {
    return;
  }
  iVar3 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&this->path,
             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             CONCAT44(extraout_var_02,iVar3));
  return;
}

Assistant:

void visitSymbol(TIntermSymbol* symbol) override {
        if (symbol->getType().isOpaque())
            topLevelStorageQualifier = symbol->getQualifier().storage;
        if (!IsAnonymous(symbol->getName()))
            path.append(symbol->getName());
    }